

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module.cpp
# Opt level: O0

uint32_t __thiscall spvtools::opt::Module::ComputeIdBound(Module *this)

{
  anon_class_8_1_b9eb6384 local_40;
  function<void_(const_spvtools::opt::Instruction_*)> local_38;
  uint32_t local_14;
  Module *pMStack_10;
  uint32_t highest;
  Module *this_local;
  
  local_14 = 0;
  local_40.highest = &local_14;
  pMStack_10 = this;
  std::function<void(spvtools::opt::Instruction_const*)>::
  function<spvtools::opt::Module::ComputeIdBound()const::__0,void>
            ((function<void(spvtools::opt::Instruction_const*)> *)&local_38,&local_40);
  ForEachInst(this,&local_38,true);
  std::function<void_(const_spvtools::opt::Instruction_*)>::~function(&local_38);
  return local_14 + 1;
}

Assistant:

uint32_t Module::ComputeIdBound() const {
  uint32_t highest = 0;

  ForEachInst(
      [&highest](const Instruction* inst) {
        for (const auto& operand : *inst) {
          if (spvIsIdType(operand.type)) {
            highest = std::max(highest, operand.words[0]);
          }
        }
      },
      true /* scan debug line insts as well */);

  return highest + 1;
}